

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply-info.cpp
# Opt level: O0

bool print_ply_header(char *filename)

{
  char *pcVar1;
  char *pcVar2;
  FILE *__stream;
  bool bVar3;
  bool bVar4;
  PLYFileType PVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  PLYElement *pPVar9;
  undefined8 uVar10;
  reference pPVar11;
  const_reference pvVar12;
  reference puVar13;
  undefined8 uVar14;
  const_iterator cStack_130;
  uint32_t rowCount;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  uint32_t firstRowCount;
  bool mixedSize;
  PLYProperty *prop_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_> *__range2_1;
  PLYElement *elem_1;
  PLYProperty *prop;
  const_iterator __end2;
  const_iterator __begin2;
  vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_> *__range2;
  PLYElement *elem;
  uint32_t endI;
  uint32_t i;
  undefined1 local_a8 [8];
  PLYReader reader;
  char *filename_local;
  
  reader.m_tmpBuf = filename;
  miniply::PLYReader::PLYReader((PLYReader *)local_a8,filename);
  bVar3 = miniply::PLYReader::valid((PLYReader *)local_a8);
  if (bVar3) {
    printf("ply\n");
    PVar5 = miniply::PLYReader::file_type((PLYReader *)local_a8);
    pcVar1 = kFileTypes[(int)PVar5];
    uVar6 = miniply::PLYReader::version_major((PLYReader *)local_a8);
    uVar7 = miniply::PLYReader::version_minor((PLYReader *)local_a8);
    printf("format %s %d.%d\n",pcVar1,(ulong)uVar6,(ulong)uVar7);
    elem._4_4_ = 0;
    uVar8 = miniply::PLYReader::num_elements((PLYReader *)local_a8);
    for (; elem._4_4_ < uVar8; elem._4_4_ = elem._4_4_ + 1) {
      pPVar9 = miniply::PLYReader::get_element((PLYReader *)local_a8,elem._4_4_);
      uVar10 = std::__cxx11::string::c_str();
      printf("element %s %u\n",uVar10,(ulong)pPVar9->count);
      __end2 = std::vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>::begin
                         (&pPVar9->properties);
      prop = (PLYProperty *)
             std::vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>::end
                       (&pPVar9->properties);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_miniply::PLYProperty_*,_std::vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>_>
                                         *)&prop), bVar3) {
        pPVar11 = __gnu_cxx::
                  __normal_iterator<const_miniply::PLYProperty_*,_std::vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>_>
                  ::operator*(&__end2);
        if (pPVar11->countType == None) {
          pcVar1 = kPropertyTypes[pPVar11->type];
          uVar10 = std::__cxx11::string::c_str();
          printf("property %s %s\n",pcVar1,uVar10);
        }
        else {
          pcVar1 = kPropertyTypes[pPVar11->countType];
          pcVar2 = kPropertyTypes[pPVar11->type];
          uVar10 = std::__cxx11::string::c_str();
          printf("property list %s %s %s\n",pcVar1,pcVar2,uVar10);
        }
        __gnu_cxx::
        __normal_iterator<const_miniply::PLYProperty_*,_std::vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>_>
        ::operator++(&__end2);
      }
    }
    printf("end_header\n");
    while (bVar3 = miniply::PLYReader::has_element((PLYReader *)local_a8), bVar3) {
      pPVar9 = miniply::PLYReader::element((PLYReader *)local_a8);
      if (((pPVar9->fixedSize & 1U) == 0) && (pPVar9->count != 0)) {
        bVar3 = miniply::PLYReader::load_element((PLYReader *)local_a8);
        __stream = _stderr;
        if (!bVar3) {
          uVar10 = std::__cxx11::string::c_str();
          fprintf(__stream,"Element %s failed to load\n",uVar10);
        }
        __end2_1 = std::vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>::begin
                             (&pPVar9->properties);
        prop_1 = (PLYProperty *)
                 std::vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>::end
                           (&pPVar9->properties);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<const_miniply::PLYProperty_*,_std::vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>_>
                                   *)&prop_1), bVar3) {
          pPVar11 = __gnu_cxx::
                    __normal_iterator<const_miniply::PLYProperty_*,_std::vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>_>
                    ::operator*(&__end2_1);
          if (pPVar11->countType != None) {
            bVar3 = false;
            pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                                (&pPVar11->rowCount);
            uVar6 = *pvVar12;
            __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               (&pPVar11->rowCount);
            cStack_130 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   (&pPVar11->rowCount);
            while (bVar4 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffed0), bVar4) {
              puVar13 = __gnu_cxx::
                        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&__end3);
              if (*puVar13 != uVar6) {
                bVar3 = true;
                break;
              }
              __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&__end3);
            }
            if (bVar3) {
              uVar10 = std::__cxx11::string::c_str();
              uVar14 = std::__cxx11::string::c_str();
              printf("Element \'%s\', list property \'%s\': not all lists have the same size\n",
                     uVar10,uVar14);
            }
            else {
              uVar10 = std::__cxx11::string::c_str();
              uVar14 = std::__cxx11::string::c_str();
              printf("Element \'%s\', list property \'%s\': all lists have size %u\n",uVar10,uVar14,
                     (ulong)uVar6);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_miniply::PLYProperty_*,_std::vector<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>_>
          ::operator++(&__end2_1);
        }
        miniply::PLYReader::next_element((PLYReader *)local_a8);
      }
      else {
        miniply::PLYReader::next_element((PLYReader *)local_a8);
      }
    }
    filename_local._7_1_ = true;
  }
  else {
    fprintf(_stderr,"Failed to open %s\n",reader.m_tmpBuf);
    filename_local._7_1_ = false;
  }
  miniply::PLYReader::~PLYReader((PLYReader *)local_a8);
  return filename_local._7_1_;
}

Assistant:

bool print_ply_header(const char* filename)
{
  miniply::PLYReader reader(filename);
  if (!reader.valid()) {
    fprintf(stderr, "Failed to open %s\n", filename);
    return false;
  }

  printf("ply\n");
  printf("format %s %d.%d\n", kFileTypes[int(reader.file_type())], reader.version_major(), reader.version_minor());
  for (uint32_t i = 0, endI = reader.num_elements(); i < endI; i++) {
    const miniply::PLYElement* elem = reader.get_element(i);
    printf("element %s %u\n", elem->name.c_str(), elem->count);
    for (const miniply::PLYProperty& prop : elem->properties) {
      if (prop.countType != miniply::PLYPropertyType::None) {
        printf("property list %s %s %s\n", kPropertyTypes[uint32_t(prop.countType)], kPropertyTypes[uint32_t(prop.type)], prop.name.c_str());
      }
      else {
        printf("property %s %s\n", kPropertyTypes[uint32_t(prop.type)], prop.name.c_str());
      }
    }
  }
  printf("end_header\n");

  while (reader.has_element()) {
    const miniply::PLYElement* elem = reader.element();
    if (elem->fixedSize || elem->count == 0) {
      reader.next_element();
      continue;
    }

    if (!reader.load_element()) {
      fprintf(stderr, "Element %s failed to load\n", elem->name.c_str());
    }
    for (const miniply::PLYProperty& prop : elem->properties) {
      if (prop.countType == miniply::PLYPropertyType::None) {
        continue;
      }
      bool mixedSize = false;
      const uint32_t firstRowCount = prop.rowCount.front();
      for (const uint32_t rowCount : prop.rowCount) {
        if (rowCount != firstRowCount) {
          mixedSize = true;
          break;
        }
      }
      if (mixedSize) {
        printf("Element '%s', list property '%s': not all lists have the same size\n",
               elem->name.c_str(), prop.name.c_str());
      }
      else {
        printf("Element '%s', list property '%s': all lists have size %u\n",
               elem->name.c_str(), prop.name.c_str(), firstRowCount);
      }
    }
    reader.next_element();
  }

  return true;
}